

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Comm_connect(char *port_name,MPIABI_Info info,int root,MPIABI_Comm comm,
                       MPIABI_Comm *newcomm)

{
  int iVar1;
  ompi_info_t *poVar2;
  ompi_communicator_t *poVar3;
  ompi_communicator_t **ppoVar4;
  WPI_HandlePtr<ompi_communicator_t_*> local_48;
  WPI_Handle local_40 [8];
  WPI_Handle local_38 [8];
  MPIABI_Comm *local_30;
  MPIABI_Comm *newcomm_local;
  MPIABI_Comm comm_local;
  MPIABI_Info MStack_18;
  int root_local;
  MPIABI_Info info_local;
  char *port_name_local;
  
  local_30 = newcomm;
  newcomm_local = (MPIABI_Comm *)comm;
  comm_local._4_4_ = root;
  MStack_18 = info;
  info_local = (MPIABI_Info)port_name;
  WPI_Handle<ompi_info_t_*>::WPI_Handle((WPI_Handle<ompi_info_t_*> *)local_38,info);
  poVar2 = WPI_Handle::operator_cast_to_ompi_info_t_(local_38);
  iVar1 = comm_local._4_4_;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle
            ((WPI_Handle<ompi_communicator_t_*> *)local_40,(uintptr_t)newcomm_local);
  poVar3 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_40);
  WPI_HandlePtr<ompi_communicator_t_*>::WPI_HandlePtr(&local_48,local_30);
  ppoVar4 = WPI_HandlePtr::operator_cast_to_ompi_communicator_t__((WPI_HandlePtr *)&local_48);
  iVar1 = MPI_Comm_connect(port_name,poVar2,iVar1,poVar3,ppoVar4);
  WPI_HandlePtr<ompi_communicator_t_*>::~WPI_HandlePtr(&local_48);
  return iVar1;
}

Assistant:

int MPIABI_Comm_connect(
  const char * port_name,
  MPIABI_Info info,
  int root,
  MPIABI_Comm comm,
  MPIABI_Comm * newcomm
) {
  return MPI_Comm_connect(
    port_name,
    (MPI_Info)(WPI_Info)info,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Comm *)(WPI_CommPtr)newcomm
  );
}